

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::constant_expression_vector_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t vector)

{
  __node_base_ptr *this_00;
  undefined4 uVar1;
  float fVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  int32_t iVar8;
  float fVar9;
  SPIRType *pSVar10;
  TypedID<(spirv_cross::Types)0> *pTVar11;
  int64_t iVar12;
  CompilerError *pCVar13;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  SPIRConstant *this_01;
  char *pcVar14;
  bool local_b49;
  bool local_b41;
  allocator local_b19;
  string local_b18 [32];
  undefined1 local_af8 [40];
  uint32_t i_14;
  string local_ab0 [32];
  undefined1 local_a90 [40];
  uint32_t i_13;
  uint8_t local_a41;
  spirv_cross local_a40 [32];
  string local_a20 [32];
  undefined1 local_a00 [40];
  uint32_t i_12;
  int16_t local_9b2;
  spirv_cross local_9b0 [32];
  string local_990 [38];
  int16_t local_96a;
  spirv_cross local_968 [32];
  undefined1 local_948 [40];
  uint32_t i_11;
  uint16_t local_8fa;
  spirv_cross local_8f8 [32];
  string local_8d8 [38];
  uint16_t local_8b2;
  spirv_cross local_8b0 [32];
  undefined1 local_890 [40];
  uint32_t i_10;
  spirv_cross local_848 [32];
  undefined1 local_828 [44];
  uint32_t i_9;
  char local_7da;
  allocator local_7d9;
  string local_7d8 [36];
  uint32_t local_7b4;
  spirv_cross local_7b0 [32];
  undefined1 local_790 [32];
  float local_770;
  char local_76a;
  allocator local_769;
  uint32_t i_8;
  uint32_t local_744;
  spirv_cross local_740 [32];
  TypedID<(spirv_cross::Types)0> *local_720;
  spirv_cross local_718 [32];
  undefined1 local_6f8 [44];
  uint32_t i_7;
  spirv_cross local_6c8 [32];
  spirv_cross local_6a8 [32];
  undefined1 local_688 [44];
  uint32_t i_6;
  string local_640 [8];
  string int64_type;
  undefined1 local_620 [8];
  SPIRType tmp;
  undefined1 local_4b0 [40];
  undefined1 local_488 [4];
  uint32_t i_5;
  undefined1 local_468 [32];
  undefined1 local_448 [32];
  undefined1 local_428 [40];
  undefined1 local_400 [4];
  uint32_t i_4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [40];
  undefined1 local_378 [4];
  uint32_t i_3;
  undefined1 local_358 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [36];
  uint local_2f4;
  uint32_t local_2f0;
  uint32_t i_2;
  uint32_t ident_1;
  uint32_t i_1;
  uint64_t ident;
  bool local_2d7;
  bool local_2d6;
  char local_2d5;
  uint32_t i;
  bool swizzle_splat;
  bool splat;
  undefined1 local_2c8 [8];
  SPIRType scalar_type;
  SPIRType type;
  uint32_t vector_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  this_01 = (SPIRConstant *)CONCAT44(in_register_00000014,vector);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this_01->super_IVariant).field_0xc);
  pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
  this_00 = &scalar_type.member_name_cache._M_h._M_single_bucket;
  SPIRType::SPIRType((SPIRType *)this_00,pSVar10);
  SPIRType::SPIRType((SPIRType *)local_2c8,(SPIRType *)this_00);
  scalar_type.super_IVariant._12_4_ = 1;
  local_2d5 = '\0';
  ::std::__cxx11::string::string((string *)this);
  local_b41 = false;
  if ((c[0x17].m.c[1].id[0].id & 0x100) != 0) {
    uVar5 = SPIRConstant::vector_size(this_01);
    local_b41 = 1 < uVar5;
  }
  local_2d6 = local_b41;
  local_b49 = false;
  if ((c[0x17].m.c[1].id[0].id & 0x1000000) != 0) {
    uVar5 = SPIRConstant::vector_size(this_01);
    local_b49 = 1 < uVar5;
  }
  local_2d7 = local_b49;
  bVar4 = type_is_floating_point((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  if (!bVar4) {
    local_2d7 = false;
  }
  if (((local_2d6 & 1U) != 0) || ((local_2d7 & 1U) != 0)) {
    for (ident._4_4_ = 0; uVar7 = ident._4_4_, uVar5 = SPIRConstant::vector_size(this_01),
        uVar7 < uVar5; ident._4_4_ = ident._4_4_ + 1) {
      uVar5 = SPIRConstant::specialization_constant_id(this_01,in_ECX,ident._4_4_);
      if (uVar5 != 0) {
        local_2d6 = false;
        local_2d7 = false;
        break;
      }
    }
  }
  if (((local_2d6 & 1U) != 0) || ((local_2d7 & 1U) != 0)) {
    if (type.super_IVariant.self.id == 0x40) {
      _ident_1 = (TypedID<(spirv_cross::Types)0> *)SPIRConstant::scalar_u64(this_01,in_ECX,0);
      for (i_2 = 1; uVar5 = i_2, uVar6 = SPIRConstant::vector_size(this_01), pTVar3 = _ident_1,
          uVar5 < uVar6; i_2 = i_2 + 1) {
        pTVar11 = (TypedID<(spirv_cross::Types)0> *)SPIRConstant::scalar_u64(this_01,in_ECX,i_2);
        if (pTVar3 != pTVar11) {
          local_2d6 = false;
          local_2d7 = false;
          break;
        }
      }
    }
    else {
      local_2f0 = SPIRConstant::scalar(this_01,in_ECX,0);
      for (local_2f4 = 1; uVar7 = local_2f4, uVar6 = SPIRConstant::vector_size(this_01),
          uVar5 = local_2f0, uVar7 < uVar6; local_2f4 = local_2f4 + 1) {
        uVar6 = SPIRConstant::scalar(this_01,in_ECX,local_2f4);
        if (uVar5 != uVar6) {
          local_2d6 = false;
          local_2d7 = false;
        }
      }
    }
  }
  uVar5 = SPIRConstant::vector_size(this_01);
  if ((1 < uVar5) && ((local_2d7 & 1U) == 0)) {
    (*(c->super_IVariant)._vptr_IVariant[0x13])
              (local_358 + 0x20,c,&scalar_type.member_name_cache._M_h._M_single_bucket,0);
    ::std::operator+(local_318,local_358 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_318);
    ::std::__cxx11::string::~string((string *)local_318);
    ::std::__cxx11::string::~string((string *)(local_358 + 0x20));
  }
  uVar5 = (uint32_t)c;
  switch(type.super_IVariant._vptr_IVariant._4_4_) {
  case 2:
    if ((local_2d6 & 1U) == 0) {
      for (local_af8._32_4_ = 0; uVar1 = local_af8._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_af8._32_4_ = local_af8._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_af8._32_4_),
           uVar6 == 0)) {
          uVar6 = SPIRConstant::scalar(this_01,in_ECX,local_af8._32_4_);
          pcVar14 = "false";
          if (uVar6 != 0) {
            pcVar14 = "true";
          }
          ::std::__cxx11::string::operator+=((string *)this,pcVar14);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_af8._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_af8,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_af8);
          ::std::__cxx11::string::~string((string *)local_af8);
        }
        uVar7 = local_af8._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      uVar5 = SPIRConstant::scalar(this_01,in_ECX,0);
      pcVar14 = "false";
      if (uVar5 != 0) {
        pcVar14 = "true";
      }
      ::std::__cxx11::string::operator+=((string *)this,pcVar14);
    }
    break;
  case 3:
    if ((local_2d6 & 1U) == 0) {
      for (local_a90._32_4_ = 0; uVar1 = local_a90._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_a90._32_4_ = local_a90._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a90._32_4_),
           uVar6 == 0)) {
          (*(c->super_IVariant)._vptr_IVariant[0x13])(local_ab0,c,local_2c8,0);
          ::std::__cxx11::string::operator+=((string *)this,local_ab0);
          ::std::__cxx11::string::~string(local_ab0);
          ::std::__cxx11::string::operator+=((string *)this,"(");
          local_af8[0x27] = SPIRConstant::scalar_i8(this_01,in_ECX,local_a90._32_4_);
          convert_to_string<signed_char,_0>((spirv_cross *)&i_14,local_af8 + 0x27);
          ::std::__cxx11::string::operator+=((string *)this,(string *)&i_14);
          ::std::__cxx11::string::~string((string *)&i_14);
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a90._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_a90,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_a90);
          ::std::__cxx11::string::~string((string *)local_a90);
        }
        uVar7 = local_a90._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_a90[0x27] = SPIRConstant::scalar_i8(this_01,in_ECX,0);
      convert_to_string<signed_char,_0>((spirv_cross *)&i_13,local_a90 + 0x27);
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_13);
      ::std::__cxx11::string::~string((string *)&i_13);
    }
    break;
  case 4:
    if ((local_2d6 & 1U) == 0) {
      for (local_a00._32_4_ = 0; uVar1 = local_a00._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_a00._32_4_ = local_a00._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a00._32_4_),
           uVar6 == 0)) {
          (*(c->super_IVariant)._vptr_IVariant[0x13])(local_a20,c,local_2c8,0);
          ::std::__cxx11::string::operator+=((string *)this,local_a20);
          ::std::__cxx11::string::~string(local_a20);
          ::std::__cxx11::string::operator+=((string *)this,"(");
          local_a41 = SPIRConstant::scalar_u8(this_01,in_ECX,local_a00._32_4_);
          convert_to_string<unsigned_char,_0>(local_a40,&local_a41);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_a40);
          ::std::__cxx11::string::~string((string *)local_a40);
          ::std::__cxx11::string::operator+=((string *)this,")");
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_a00._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_a00,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_a00);
          ::std::__cxx11::string::~string((string *)local_a00);
        }
        uVar7 = local_a00._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_a00[0x27] = SPIRConstant::scalar_u8(this_01,in_ECX,0);
      convert_to_string<unsigned_char,_0>((spirv_cross *)&i_12,local_a00 + 0x27);
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_12);
      ::std::__cxx11::string::~string((string *)&i_12);
    }
    break;
  case 5:
    if ((local_2d6 & 1U) == 0) {
      for (local_948._32_4_ = 0; uVar1 = local_948._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_948._32_4_ = local_948._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_948._32_4_),
           uVar6 == 0)) {
          if (**(char **)&c[0x17].m.c[0].vecsize == '\0') {
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_990,c,local_2c8,0);
            ::std::__cxx11::string::operator+=((string *)this,local_990);
            ::std::__cxx11::string::~string(local_990);
            ::std::__cxx11::string::operator+=((string *)this,"(");
            local_9b2 = SPIRConstant::scalar_i16(this_01,in_ECX,local_948._32_4_);
            convert_to_string<short,_0>(local_9b0,&local_9b2);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_9b0);
            ::std::__cxx11::string::~string((string *)local_9b0);
            ::std::__cxx11::string::operator+=((string *)this,")");
          }
          else {
            local_96a = SPIRConstant::scalar_i16(this_01,in_ECX,local_948._32_4_);
            convert_to_string<short,_0>(local_968,&local_96a);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_968);
            ::std::__cxx11::string::~string((string *)local_968);
            ::std::__cxx11::string::operator+=((string *)this,*(char **)&c[0x17].m.c[0].vecsize);
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_948._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_948,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_948);
          ::std::__cxx11::string::~string((string *)local_948);
        }
        uVar7 = local_948._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_948._38_2_ = SPIRConstant::scalar_i16(this_01,in_ECX,0);
      convert_to_string<short,_0>((spirv_cross *)&i_11,(short *)(local_948 + 0x26));
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_11);
      ::std::__cxx11::string::~string((string *)&i_11);
    }
    break;
  case 6:
    if ((local_2d6 & 1U) == 0) {
      for (local_890._32_4_ = 0; uVar1 = local_890._32_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_890._32_4_ = local_890._32_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_890._32_4_),
           uVar6 == 0)) {
          if (*(char *)c[0x17].m.c[1].r[0] == '\0') {
            (*(c->super_IVariant)._vptr_IVariant[0x13])(local_8d8,c,local_2c8,0);
            ::std::__cxx11::string::operator+=((string *)this,local_8d8);
            ::std::__cxx11::string::~string(local_8d8);
            ::std::__cxx11::string::operator+=((string *)this,"(");
            local_8fa = SPIRConstant::scalar_u16(this_01,in_ECX,local_890._32_4_);
            convert_to_string<unsigned_short,_0>(local_8f8,&local_8fa);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_8f8);
            ::std::__cxx11::string::~string((string *)local_8f8);
            ::std::__cxx11::string::operator+=((string *)this,")");
          }
          else {
            local_8b2 = SPIRConstant::scalar_u16(this_01,in_ECX,local_890._32_4_);
            convert_to_string<unsigned_short,_0>(local_8b0,&local_8b2);
            ::std::__cxx11::string::operator+=((string *)this,(string *)local_8b0);
            ::std::__cxx11::string::~string((string *)local_8b0);
            ::std::__cxx11::string::operator+=((string *)this,(char *)c[0x17].m.c[1].r[0]);
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_890._32_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_890,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_890);
          ::std::__cxx11::string::~string((string *)local_890);
        }
        uVar7 = local_890._32_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_890._36_4_ = SPIRConstant::scalar(this_01,in_ECX,0);
      convert_to_string<unsigned_int,_0>((spirv_cross *)&i_10,(uint *)(local_890 + 0x24));
      ::std::__cxx11::string::operator+=((string *)this,(string *)&i_10);
      ::std::__cxx11::string::~string((string *)&i_10);
    }
    break;
  case 7:
    if ((local_2d6 & 1U) == 0) {
      for (local_828._36_4_ = 0; uVar1 = local_828._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_828._36_4_ = local_828._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_828._36_4_),
           uVar6 == 0)) {
          iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,local_828._36_4_);
          convert_to_string_abi_cxx11_(local_848,iVar8);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_848);
          ::std::__cxx11::string::~string((string *)local_848);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_828._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_828,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_828);
          ::std::__cxx11::string::~string((string *)local_828);
        }
        uVar7 = local_828._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,0);
      convert_to_string_abi_cxx11_((spirv_cross *)(local_828 + 0x28),iVar8);
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_828 + 0x28));
      ::std::__cxx11::string::~string((string *)(local_828 + 0x28));
    }
    break;
  case 8:
    if ((local_2d6 & 1U) == 0) {
      for (local_770 = 0.0; fVar2 = local_770, fVar9 = (float)SPIRConstant::vector_size(this_01),
          (uint)fVar2 < (uint)fVar9; local_770 = (float)((int)local_770 + 1)) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,(uint32_t)local_770),
           uVar6 == 0)) {
          local_7b4 = SPIRConstant::scalar(this_01,in_ECX,(uint32_t)local_770);
          convert_to_string<unsigned_int,_0>(local_7b0,&local_7b4);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_7b0);
          ::std::__cxx11::string::~string((string *)local_7b0);
          bVar4 = is_legacy((CompilerGLSL *)c);
          if (bVar4) {
            iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,(uint32_t)local_770);
            if (iVar8 < 0) {
              local_7da = '\x01';
              pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_7d8,
                         "Tried to convert uint literal into int, but this made the literal negative."
                         ,&local_7d9);
              CompilerError::CompilerError(pCVar13,(string *)local_7d8);
              local_7da = '\0';
              __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
          }
          else if ((c[0x17].super_IVariant.self.id & 0x10000) != 0) {
            ::std::__cxx11::string::operator+=((string *)this,"u");
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,(uint32_t)local_770);
          to_expression_abi_cxx11_((CompilerGLSL *)local_790,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_790);
          ::std::__cxx11::string::~string((string *)local_790);
        }
        uVar7 = (int)local_770 + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      local_744 = SPIRConstant::scalar(this_01,in_ECX,0);
      convert_to_string<unsigned_int,_0>(local_740,&local_744);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_740);
      ::std::__cxx11::string::~string((string *)local_740);
      bVar4 = is_legacy((CompilerGLSL *)c);
      if (bVar4) {
        iVar8 = SPIRConstant::scalar_i32(this_01,in_ECX,0);
        if (iVar8 < 0) {
          local_76a = '\x01';
          pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&i_8,
                     "Tried to convert uint literal into int, but this made the literal negative.",
                     &local_769);
          CompilerError::CompilerError(pCVar13,(string *)&i_8);
          local_76a = '\0';
          __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      else if ((c[0x17].super_IVariant.self.id & 0x10000) != 0) {
        ::std::__cxx11::string::operator+=((string *)this,"u");
      }
    }
    break;
  case 9:
    SPIRType::SPIRType((SPIRType *)local_620,
                       (SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
    tmp.super_IVariant._12_4_ = 1;
    tmp.width = 1;
    (*(c->super_IVariant)._vptr_IVariant[0x13])(local_640,c,local_620,0);
    if ((local_2d6 & 1U) == 0) {
      for (local_688._36_4_ = 0; uVar1 = local_688._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_688._36_4_ = local_688._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_688._36_4_),
           uVar6 == 0)) {
          iVar12 = SPIRConstant::scalar_i64(this_01,in_ECX,local_688._36_4_);
          convert_to_string(local_6a8,iVar12,local_640,
                            (bool)(*(byte *)((long)&c[0x17].super_IVariant.self.id + 3) & 1));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_6a8);
          ::std::__cxx11::string::~string((string *)local_6a8);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_688._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_688,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_688);
          ::std::__cxx11::string::~string((string *)local_688);
        }
        uVar7 = local_688._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      iVar12 = SPIRConstant::scalar_i64(this_01,in_ECX,0);
      convert_to_string((spirv_cross *)(local_688 + 0x28),iVar12,local_640,
                        (bool)(*(byte *)((long)&c[0x17].super_IVariant.self.id + 3) & 1));
      ::std::__cxx11::string::operator+=((string *)this,(string *)(local_688 + 0x28));
      ::std::__cxx11::string::~string((string *)(local_688 + 0x28));
    }
    ::std::__cxx11::string::~string((string *)local_640);
    SPIRType::~SPIRType((SPIRType *)local_620);
    break;
  case 10:
    if ((local_2d6 & 1U) == 0) {
      for (local_6f8._36_4_ = 0; uVar1 = local_6f8._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_6f8._36_4_ = local_6f8._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_6f8._36_4_),
           uVar6 == 0)) {
          local_720 = (TypedID<(spirv_cross::Types)0> *)
                      SPIRConstant::scalar_u64(this_01,in_ECX,local_6f8._36_4_);
          convert_to_string<unsigned_long,_0>(local_718,(unsigned_long *)&local_720);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_718);
          ::std::__cxx11::string::~string((string *)local_718);
          if ((c[0x17].super_IVariant.self.id & 0x1000000) == 0) {
            ::std::__cxx11::string::operator+=((string *)this,"ul");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)this,"ull");
          }
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_6f8._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_6f8,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_6f8);
          ::std::__cxx11::string::~string((string *)local_6f8);
        }
        uVar7 = local_6f8._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      register0x00000000 = (Variant *)SPIRConstant::scalar_u64(this_01,in_ECX,0);
      convert_to_string<unsigned_long,_0>(local_6c8,(unsigned_long *)(local_6f8 + 0x28));
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_6c8);
      ::std::__cxx11::string::~string((string *)local_6c8);
      if ((c[0x17].super_IVariant.self.id & 0x1000000) == 0) {
        ::std::__cxx11::string::operator+=((string *)this,"ul");
      }
      else {
        ::std::__cxx11::string::operator+=((string *)this,"ull");
      }
    }
    break;
  default:
    pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b18,"Invalid constant expression basetype.",&local_b19);
    CompilerError::CompilerError(pCVar13,(string *)local_b18);
    __cxa_throw(pCVar13,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0xc:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_3a0._36_4_ = 0; uVar1 = local_3a0._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_3a0._36_4_ = local_3a0._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_3a0._36_4_),
           uVar6 == 0)) {
          convert_half_to_string_abi_cxx11_((CompilerGLSL *)local_3c0,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3c0);
          ::std::__cxx11::string::~string((string *)local_3c0);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_3a0._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_3a0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_3a0);
          ::std::__cxx11::string::~string((string *)local_3a0);
        }
        uVar7 = local_3a0._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_half_to_string_abi_cxx11_((CompilerGLSL *)local_358,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_358);
      ::std::__cxx11::string::~string((string *)local_358);
      if ((local_2d7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_378,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_378);
        ::std::__cxx11::string::~string((string *)local_378);
      }
    }
    break;
  case 0xd:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_428._36_4_ = 0; uVar1 = local_428._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_428._36_4_ = local_428._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_428._36_4_),
           uVar6 == 0)) {
          convert_float_to_string_abi_cxx11_((CompilerGLSL *)local_448,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_448);
          ::std::__cxx11::string::~string((string *)local_448);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_428._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_428,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_428);
          ::std::__cxx11::string::~string((string *)local_428);
        }
        uVar7 = local_428._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_float_to_string_abi_cxx11_((CompilerGLSL *)local_3e0,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_3e0);
      ::std::__cxx11::string::~string((string *)local_3e0);
      if ((local_2d7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_400,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_400);
        ::std::__cxx11::string::~string((string *)local_400);
      }
    }
    break;
  case 0xe:
    if (((local_2d6 & 1U) == 0) && ((local_2d7 & 1U) == 0)) {
      for (local_4b0._36_4_ = 0; uVar1 = local_4b0._36_4_,
          uVar6 = SPIRConstant::vector_size(this_01), (uint)uVar1 < uVar6;
          local_4b0._36_4_ = local_4b0._36_4_ + 1) {
        uVar6 = SPIRConstant::vector_size(this_01);
        if ((uVar6 < 2) ||
           (uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_4b0._36_4_),
           uVar6 == 0)) {
          convert_double_to_string_abi_cxx11_
                    ((CompilerGLSL *)&tmp.member_name_cache._M_h._M_single_bucket,c,vector,in_ECX);
          ::std::__cxx11::string::operator+=
                    ((string *)this,(string *)&tmp.member_name_cache._M_h._M_single_bucket);
          ::std::__cxx11::string::~string((string *)&tmp.member_name_cache._M_h._M_single_bucket);
        }
        else {
          uVar6 = SPIRConstant::specialization_constant_id(this_01,in_ECX,local_4b0._36_4_);
          to_expression_abi_cxx11_((CompilerGLSL *)local_4b0,uVar5,SUB41(uVar6,0));
          ::std::__cxx11::string::operator+=((string *)this,(string *)local_4b0);
          ::std::__cxx11::string::~string((string *)local_4b0);
        }
        uVar7 = local_4b0._36_4_ + 1;
        uVar6 = SPIRConstant::vector_size(this_01);
        if (uVar7 < uVar6) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
    }
    else {
      convert_double_to_string_abi_cxx11_((CompilerGLSL *)local_468,c,vector,in_ECX);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_468);
      ::std::__cxx11::string::~string((string *)local_468);
      if ((local_2d7 & 1U) != 0) {
        uVar5 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(this_01->super_IVariant).field_0xc);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)c,uVar5);
        remap_swizzle((CompilerGLSL *)local_488,(SPIRType *)c,(uint32_t)pSVar10,(string *)0x1);
        ::std::__cxx11::string::operator=((string *)this,(string *)local_488);
        ::std::__cxx11::string::~string((string *)local_488);
      }
    }
  }
  uVar5 = SPIRConstant::vector_size(this_01);
  if ((1 < uVar5) && ((local_2d7 & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)this,")");
  }
  local_2d5 = '\x01';
  SPIRType::~SPIRType((SPIRType *)local_2c8);
  SPIRType::~SPIRType((SPIRType *)&scalar_type.member_name_cache._M_h._M_single_bucket);
  return this;
}

Assistant:

string CompilerGLSL::constant_expression_vector(const SPIRConstant &c, uint32_t vector)
{
	auto type = get<SPIRType>(c.constant_type);
	type.columns = 1;

	auto scalar_type = type;
	scalar_type.vecsize = 1;

	string res;
	bool splat = backend.use_constructor_splatting && c.vector_size() > 1;
	bool swizzle_splat = backend.can_swizzle_scalar && c.vector_size() > 1;

	if (!type_is_floating_point(type))
	{
		// Cannot swizzle literal integers as a special case.
		swizzle_splat = false;
	}

	if (splat || swizzle_splat)
	{
		// Cannot use constant splatting if we have specialization constants somewhere in the vector.
		for (uint32_t i = 0; i < c.vector_size(); i++)
		{
			if (c.specialization_constant_id(vector, i) != 0)
			{
				splat = false;
				swizzle_splat = false;
				break;
			}
		}
	}

	if (splat || swizzle_splat)
	{
		if (type.width == 64)
		{
			uint64_t ident = c.scalar_u64(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar_u64(vector, i))
				{
					splat = false;
					swizzle_splat = false;
					break;
				}
			}
		}
		else
		{
			uint32_t ident = c.scalar(vector, 0);
			for (uint32_t i = 1; i < c.vector_size(); i++)
			{
				if (ident != c.scalar(vector, i))
				{
					splat = false;
					swizzle_splat = false;
				}
			}
		}
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += type_to_glsl(type) + "(";

	switch (type.basetype)
	{
	case SPIRType::Half:
		if (splat || swizzle_splat)
		{
			res += convert_half_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_half_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Float:
		if (splat || swizzle_splat)
		{
			res += convert_float_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_float_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Double:
		if (splat || swizzle_splat)
		{
			res += convert_double_to_string(c, vector, 0);
			if (swizzle_splat)
				res = remap_swizzle(get<SPIRType>(c.constant_type), 1, res);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_double_to_string(c, vector, i);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int64:
	{
		auto tmp = type;
		tmp.vecsize = 1;
		tmp.columns = 1;
		auto int64_type = type_to_glsl(tmp);

		if (splat)
		{
			res += convert_to_string(c.scalar_i64(vector, 0), int64_type, backend.long_long_literal_suffix);
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i64(vector, i), int64_type, backend.long_long_literal_suffix);

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;
	}

	case SPIRType::UInt64:
		if (splat)
		{
			res += convert_to_string(c.scalar_u64(vector, 0));
			if (backend.long_long_literal_suffix)
				res += "ull";
			else
				res += "ul";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar_u64(vector, i));
					if (backend.long_long_literal_suffix)
						res += "ull";
					else
						res += "ul";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UInt:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
			if (is_legacy())
			{
				// Fake unsigned constant literals with signed ones if possible.
				// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
				if (c.scalar_i32(vector, 0) < 0)
					SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made the literal negative.");
			}
			else if (backend.uint32_t_literal_suffix)
				res += "u";
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += convert_to_string(c.scalar(vector, i));
					if (is_legacy())
					{
						// Fake unsigned constant literals with signed ones if possible.
						// Things like array sizes, etc, tend to be unsigned even though they could just as easily be signed.
						if (c.scalar_i32(vector, i) < 0)
							SPIRV_CROSS_THROW("Tried to convert uint literal into int, but this made "
							                  "the literal negative.");
					}
					else if (backend.uint32_t_literal_suffix)
						res += "u";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Int:
		if (splat)
			res += convert_to_string(c.scalar_i32(vector, 0));
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += convert_to_string(c.scalar_i32(vector, i));
				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UShort:
		if (splat)
		{
			res += convert_to_string(c.scalar(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.uint16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_u16(vector, i));
						res += backend.uint16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_u16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Short:
		if (splat)
		{
			res += convert_to_string(c.scalar_i16(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					if (*backend.int16_t_literal_suffix)
					{
						res += convert_to_string(c.scalar_i16(vector, i));
						res += backend.int16_t_literal_suffix;
					}
					else
					{
						// If backend doesn't have a literal suffix, we need to value cast.
						res += type_to_glsl(scalar_type);
						res += "(";
						res += convert_to_string(c.scalar_i16(vector, i));
						res += ")";
					}
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::UByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_u8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_u8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::SByte:
		if (splat)
		{
			res += convert_to_string(c.scalar_i8(vector, 0));
		}
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
				{
					res += type_to_glsl(scalar_type);
					res += "(";
					res += convert_to_string(c.scalar_i8(vector, i));
					res += ")";
				}

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	case SPIRType::Boolean:
		if (splat)
			res += c.scalar(vector, 0) ? "true" : "false";
		else
		{
			for (uint32_t i = 0; i < c.vector_size(); i++)
			{
				if (c.vector_size() > 1 && c.specialization_constant_id(vector, i) != 0)
					res += to_expression(c.specialization_constant_id(vector, i));
				else
					res += c.scalar(vector, i) ? "true" : "false";

				if (i + 1 < c.vector_size())
					res += ", ";
			}
		}
		break;

	default:
		SPIRV_CROSS_THROW("Invalid constant expression basetype.");
	}

	if (c.vector_size() > 1 && !swizzle_splat)
		res += ")";

	return res;
}